

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *pMVar2;
  MessageLite *to_msg_00;
  ulong uVar3;
  void *pvVar4;
  _func_int **pp_Var5;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg != to_msg) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 7) == 0) goto LAB_0025f7e4;
    if ((uVar1 & 1) != 0) {
      pMVar2 = (MessageLite *)from_msg[1]._internal_metadata_.ptr_;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_0025f836;
      to_msg_00 = (MessageLite *)to_msg[1]._internal_metadata_.ptr_;
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar4 = Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,pMVar2);
        to_msg[1]._internal_metadata_.ptr_ = (intptr_t)pvVar4;
      }
      else {
        FeatureSet::MergeImpl(to_msg_00,pMVar2);
      }
    }
    if ((uVar1 & 2) != 0) {
      pMVar2 = (MessageLite *)from_msg[2]._vptr_MessageLite;
      if (pMVar2 == (MessageLite *)0x0) goto LAB_0025f840;
      if ((MessageLite *)to_msg[2]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var5 = (_func_int **)Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,pMVar2);
        to_msg[2]._vptr_MessageLite = pp_Var5;
      }
      else {
        FeatureSet::MergeImpl((MessageLite *)to_msg[2]._vptr_MessageLite,pMVar2);
      }
    }
    if ((uVar1 & 4) != 0) {
      *(int *)&to_msg[2]._internal_metadata_.ptr_ = (int)from_msg[2]._internal_metadata_.ptr_;
    }
LAB_0025f7e4:
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
    uVar3 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar3 & 1) == 0) {
      return;
    }
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8));
    return;
  }
  MergeImpl();
LAB_0025f836:
  MergeImpl((FeatureSetDefaults_FeatureSetEditionDefault *)&stack0xffffffffffffffd0);
LAB_0025f840:
  MergeImpl((FeatureSetDefaults_FeatureSetEditionDefault *)&stack0xffffffffffffffd0);
}

Assistant:

void FeatureSetDefaults_FeatureSetEditionDefault::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FeatureSetDefaults_FeatureSetEditionDefault*>(&to_msg);
  auto& from = static_cast<const FeatureSetDefaults_FeatureSetEditionDefault&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.overridable_features_ != nullptr);
      if (_this->_impl_.overridable_features_ == nullptr) {
        _this->_impl_.overridable_features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.overridable_features_);
      } else {
        _this->_impl_.overridable_features_->MergeFrom(*from._impl_.overridable_features_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.fixed_features_ != nullptr);
      if (_this->_impl_.fixed_features_ == nullptr) {
        _this->_impl_.fixed_features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.fixed_features_);
      } else {
        _this->_impl_.fixed_features_->MergeFrom(*from._impl_.fixed_features_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.edition_ = from._impl_.edition_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}